

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::IsSingular(ON_NurbsSurface *this,int side)

{
  bool bVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  double *points;
  
  switch(side) {
  case 0:
    bVar1 = ON_IsKnotVectorClamped(this->m_order[1],this->m_cv_count[1],this->m_knot[1],0);
    if (!bVar1) {
      return false;
    }
    piVar4 = this->m_cv_count;
    piVar3 = this->m_cv_stride;
    points = this->m_cv;
    goto LAB_00546546;
  case 1:
    bVar1 = ON_IsKnotVectorClamped(this->m_order[0],this->m_cv_count[0],this->m_knot[0],1);
    if (!bVar1) {
      return false;
    }
    uVar2 = (this->m_cv_count[0] + -1) * this->m_cv_stride[0];
    points = (double *)0x0;
    if (-1 < (int)uVar2) {
      points = this->m_cv + uVar2;
    }
    if (this->m_cv == (double *)0x0) {
      points = (double *)0x0;
    }
    break;
  case 2:
    bVar1 = ON_IsKnotVectorClamped(this->m_order[1],this->m_cv_count[1],this->m_knot[1],1);
    if (!bVar1) {
      return false;
    }
    uVar2 = (this->m_cv_count[1] + -1) * this->m_cv_stride[1];
    piVar4 = this->m_cv_count;
    points = (double *)0x0;
    if (-1 < (int)uVar2) {
      points = this->m_cv + uVar2;
    }
    piVar3 = this->m_cv_stride;
    if (this->m_cv == (double *)0x0) {
      points = (double *)0x0;
    }
    goto LAB_00546546;
  case 3:
    bVar1 = ON_IsKnotVectorClamped(this->m_order[0],this->m_cv_count[0],this->m_knot[0],0);
    if (!bVar1) {
      return false;
    }
    points = this->m_cv;
    break;
  default:
    return false;
  }
  piVar3 = this->m_cv_stride + 1;
  piVar4 = this->m_cv_count + 1;
LAB_00546546:
  bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,*piVar4,*piVar3,points);
  return bVar1;
}

Assistant:

bool
ON_NurbsSurface::IsSingular( // true if surface side is collapsed to a point
      int side   // side of parameter space to test
                 // 0 = south, 1 = east, 2 = north, 3 = west
      ) const
{
  bool rc = false;
  const double* points = 0;
  int point_count = 0;
  int point_stride = 0;

  switch ( side ) 
  {
  case 0: // south
    rc = IsClamped(1,0)?true:false;
    if ( rc )
    {
      points = CV(0,0);
      point_count = m_cv_count[0];
      point_stride = m_cv_stride[0];
    }
    break;

  case 1: // east
    rc = IsClamped(0,1)?true:false;
    if (rc)
    {
      points = CV(m_cv_count[0]-1,0);
      point_count = m_cv_count[1];
      point_stride = m_cv_stride[1];
    }
    break;

  case 2: // north
    rc  = IsClamped(1,1)?true:false;
    if (rc)
    {
      points = CV(0,m_cv_count[1]-1);
      point_count = m_cv_count[0];
      point_stride = m_cv_stride[0];
    }
    break;

  case 3: // west
    rc = IsClamped( 0, 0 )?true:false;
    if (rc) 
    {
      points = CV(0,0);
      point_count = m_cv_count[1];
      point_stride = m_cv_stride[1];
    }
    break;

  default:
    rc = false;
    break;
  }

  if (rc)
    rc = ON_PointsAreCoincident(m_dim,m_is_rat,point_count,point_stride,points);

  return rc;
}